

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O1

bool Rml::BuildToken(String *token,char **token_begin,char *string_end,bool first_token,
                    bool collapse_white_space,bool break_at_endline,
                    TextTransform text_transformation,bool decode_escape_characters)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  char *pcVar7;
  byte bVar8;
  char cVar9;
  ulong uVar10;
  bool bVar11;
  String escape_code;
  long *local_50 [2];
  long local_40 [2];
  
  if ((*token_begin == string_end) &&
     (bVar3 = Assert("RMLUI_ASSERT(token_begin != string_end)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0x1fd), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  ::std::__cxx11::string::reserve((ulong)token);
  bVar4 = **token_begin;
  if ((0x20 < (ulong)bVar4) || (bVar2 = 1, (0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) {
    bVar2 = 0;
  }
  do {
    pbVar6 = (byte *)*token_begin;
    if (pbVar6 == (byte *)string_end) {
      bVar4 = 0;
      break;
    }
    bVar8 = *pbVar6;
    bVar3 = true;
    if (bVar8 == 0x26 && decode_escape_characters) {
      pcVar7 = *token_begin;
      bVar11 = pcVar7 == string_end;
      if (!bVar11) {
        cVar9 = *pcVar7;
        while (cVar9 != ';') {
          pcVar7 = pcVar7 + 1;
          *token_begin = pcVar7;
          bVar11 = pcVar7 == string_end;
          if (bVar11) goto LAB_00233521;
          cVar9 = *pcVar7;
        }
        if (!bVar11) {
          local_50[0] = local_40;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pbVar6 + 1,pcVar7);
          iVar5 = ::std::__cxx11::string::compare((char *)local_50);
          bVar3 = true;
          if (iVar5 == 0) {
            bVar8 = 0x3c;
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)local_50);
            if (iVar5 == 0) {
              bVar8 = 0x3e;
            }
            else {
              iVar5 = ::std::__cxx11::string::compare((char *)local_50);
              if (iVar5 == 0) {
                bVar8 = 0x26;
              }
              else {
                iVar5 = ::std::__cxx11::string::compare((char *)local_50);
                if (iVar5 == 0) {
                  bVar8 = 0x22;
                }
                else {
                  iVar5 = ::std::__cxx11::string::compare((char *)local_50);
                  if (iVar5 == 0) {
                    bVar8 = 0x20;
                  }
                  else {
                    *token_begin = (char *)pbVar6;
                  }
                  bVar3 = iVar5 != 0;
                }
              }
            }
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          goto LAB_002335f0;
        }
      }
LAB_00233521:
      *token_begin = (char *)pbVar6;
    }
LAB_002335f0:
    cVar9 = (char)token;
    if (bVar8 == 10 && break_at_endline) {
      ::std::__cxx11::string::push_back(cVar9);
      *token_begin = *token_begin + 1;
      bVar4 = 1;
      bVar3 = false;
    }
    else {
      if ((bool)(bVar3 & bVar8 < 0x21)) {
        uVar10 = 0x100002600 >> (bVar8 & 0x3f);
      }
      else {
        uVar10 = 0;
      }
      if (((byte)uVar10 & 1) == bVar2) {
LAB_0023369d:
        if (((uVar10 & 1) == 0) || (!collapse_white_space)) {
          ::std::__cxx11::string::push_back(cVar9);
        }
        *token_begin = *token_begin + 1;
        bVar3 = true;
      }
      else {
        if (collapse_white_space) {
          if (bVar2 != 0) {
            if (!first_token) {
              ::std::__cxx11::string::push_back(cVar9);
            }
            bVar2 = 0;
            goto LAB_0023369d;
          }
          pbVar6 = (byte *)*token_begin;
          if (pbVar6 != (byte *)string_end) {
            do {
              bVar4 = *pbVar6;
              if (((0x20 < (ulong)bVar4) || ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) ||
                 (break_at_endline && bVar4 == 10)) goto LAB_002336e7;
              pbVar6 = pbVar6 + 1;
            } while (pbVar6 != (byte *)string_end);
            ::std::__cxx11::string::push_back(cVar9);
          }
        }
        else {
          *token_begin = (char *)pbVar6;
        }
LAB_002336e7:
        bVar3 = false;
        bVar4 = 0;
      }
    }
  } while (bVar3);
  return (bool)(bVar4 & 1);
}

Assistant:

static bool BuildToken(String& token, const char*& token_begin, const char* string_end, bool first_token, bool collapse_white_space,
	bool break_at_endline, Style::TextTransform text_transformation, bool decode_escape_characters)
{
	RMLUI_ASSERT(token_begin != string_end);

	token.reserve(string_end - token_begin + token.size());

	// Check what the first character of the token is; all we need to know is if it is white-space or not.
	bool parsing_white_space = StringUtilities::IsWhitespace(*token_begin);

	// Loop through the string from the token's beginning until we find an end to the token. This can occur in various
	// places, depending on the white-space processing;
	//  - at the end of a section of non-white-space characters,
	//  - at the end of a section of white-space characters, if we're not collapsing white-space,
	//  - at an endline token, if we're breaking on endlines.
	while (token_begin != string_end)
	{
		bool force_non_whitespace = false;
		char character = *token_begin;

		const char* escape_begin = token_begin;

		// Check for an ampersand; if we find one, we've got an HTML escaped character.
		if (decode_escape_characters && character == '&')
		{
			// Find the terminating ';'.
			while (token_begin != string_end && *token_begin != ';')
				++token_begin;

			// If we couldn't find the ';', print the token like normal text.
			if (token_begin == string_end)
			{
				token_begin = escape_begin;
			}
			// We could find a ';', parse the escape code. If the escape code is recognised, set the parsed character
			// to the appropriate one. If it is a non-breaking space, prevent it being picked up as whitespace. If it
			// is not recognised, print the token like normal text.
			else
			{
				String escape_code(escape_begin + 1, token_begin);

				if (escape_code == "lt")
					character = '<';
				else if (escape_code == "gt")
					character = '>';
				else if (escape_code == "amp")
					character = '&';
				else if (escape_code == "quot")
					character = '"';
				else if (escape_code == "nbsp")
				{
					character = ' ';
					force_non_whitespace = true;
				}
				else
					token_begin = escape_begin;
			}
		}

		// Check for an endline token; if we're breaking on endlines and we find one, then return true to indicate a
		// forced break.
		if (break_at_endline && character == '\n')
		{
			token += '\n';
			token_begin++;
			return true;
		}

		// If we've transitioned from white-space characters to non-white-space characters, or vice-versa, then check
		// if should terminate the token; if we're not collapsing white-space, then yes (as sections of white-space are
		// non-breaking), otherwise only if we've transitioned from characters to white-space.
		bool white_space = !force_non_whitespace && StringUtilities::IsWhitespace(character);
		if (white_space != parsing_white_space)
		{
			if (!collapse_white_space)
			{
				// Restore pointer to the beginning of the escaped token, if we processed an escape code.
				token_begin = escape_begin;
				return false;
			}

			// We're collapsing white-space; we only tokenise words, not white-space, so we're only done tokenising
			// once we've begun parsing non-white-space and then found white-space.
			if (!parsing_white_space)
			{
				// However, if we are the last non-whitespace character in the string, and there are trailing
				// whitespace characters after this token, then we need to append a single space to the end of this
				// token.
				if (token_begin != string_end && LastToken(token_begin, string_end, collapse_white_space, break_at_endline))
					token += ' ';

				return false;
			}

			// We've transitioned from white-space to non-white-space, so we append a single white-space character.
			if (!first_token)
				token += ' ';

			parsing_white_space = false;
		}

		// If the current character is white-space, we'll append a space character to the token if we're not collapsing
		// sections of white-space.
		if (white_space)
		{
			if (!collapse_white_space)
				token += ' ';
		}
		else
		{
			if (text_transformation == Style::TextTransform::Uppercase)
			{
				if (character >= 'a' && character <= 'z')
					character += ('A' - 'a');
			}
			else if (text_transformation == Style::TextTransform::Lowercase)
			{
				if (character >= 'A' && character <= 'Z')
					character -= ('A' - 'a');
			}

			token += character;
		}

		++token_begin;
	}

	return false;
}